

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int source_set_filter(SOURCE_HANDLE source,filter_set filter_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  SOURCE_INSTANCE *source_instance;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar2 = 0x32f9;
  }
  else {
    item_value = amqpvalue_clone(filter_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x3301;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,7,item_value);
      iVar2 = 0x3307;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int source_set_filter(SOURCE_HANDLE source, filter_set filter_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE filter_amqp_value = amqpvalue_create_filter_set(filter_value);
        if (filter_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 7, filter_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(filter_amqp_value);
        }
    }

    return result;
}